

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

BasicBlock * __thiscall
spvtools::opt::LoopPeeling::ProtectLoop
          (LoopPeeling *this,Loop *loop,Instruction *condition,BasicBlock *if_merge)

{
  byte bVar1;
  uint32_t cond_id;
  uint32_t true_id;
  uint32_t false_id;
  uint32_t merge_id;
  BasicBlock *pBVar2;
  Instruction *pIVar3;
  InstructionBuilder builder;
  InstructionBuilder local_50;
  
  pBVar2 = Loop::GetOrCreatePreHeaderBlock(loop);
  Loop::SetPreHeaderBlock(loop,(BasicBlock *)0x0);
  pIVar3 = (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar3 != (Instruction *)0x0) &&
     ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    IRContext::KillInst(this->context_,
                        (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
    local_50.context_ = this->context_;
    local_50.insert_before_.super_iterator.node_ =
         (iterator)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    local_50.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
    true_id = 0;
    cond_id = 0;
    local_50.parent_ = pBVar2;
    if (condition->has_result_id_ == true) {
      cond_id = Instruction::GetSingleWordOperand(condition,(uint)condition->has_type_id_);
    }
    pIVar3 = (loop->loop_header_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar3->has_result_id_ == true) {
      true_id = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    pIVar3 = (if_merge->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    bVar1 = pIVar3->has_result_id_;
    merge_id = 0;
    if ((bool)bVar1 == true) {
      false_id = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
      pIVar3 = (if_merge->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      bVar1 = pIVar3->has_result_id_;
    }
    else {
      false_id = 0;
    }
    if ((bVar1 & 1) != 0) {
      merge_id = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    InstructionBuilder::AddConditionalBranch(&local_50,cond_id,true_id,false_id,merge_id,0);
    return pBVar2;
  }
  __assert_fail("!insts_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
}

Assistant:

BasicBlock* LoopPeeling::ProtectLoop(Loop* loop, Instruction* condition,
                                     BasicBlock* if_merge) {
  // TODO(1841): Handle failure to create pre-header.
  BasicBlock* if_block = loop->GetOrCreatePreHeaderBlock();
  // Will no longer be a pre-header because of the if.
  loop->SetPreHeaderBlock(nullptr);
  // Kill the branch to the header.
  context_->KillInst(&*if_block->tail());

  InstructionBuilder builder(
      context_, if_block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  builder.AddConditionalBranch(condition->result_id(),
                               loop->GetHeaderBlock()->id(), if_merge->id(),
                               if_merge->id());

  return if_block;
}